

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O2

void __thiscall Clasp::SatPreprocessor::freezeSeen(SatPreprocessor *this)

{
  uint uVar1;
  uint uVar2;
  Var v;
  uint v_00;
  
  v_00 = (this->seen_).lo;
  uVar1 = (this->ctx_->varInfo_).ebo_.size;
  if (uVar1 <= v_00) {
    (this->seen_).lo = 1;
    v_00 = 1;
  }
  uVar2 = (this->seen_).hi;
  if (uVar1 <= uVar2) {
    (this->seen_).hi = uVar1;
    uVar2 = uVar1;
  }
  for (; v_00 != uVar2; v_00 = v_00 + 1) {
    if (((*(this->ctx_->solvers_).ebo_.buf)->assign_).assign_.ebo_.buf[v_00] < 0xfffffff0) {
      SharedContext::setFrozen(this->ctx_,v_00,true);
      uVar2 = (this->seen_).hi;
    }
  }
  (this->seen_).lo = uVar2;
  return;
}

Assistant:

void SatPreprocessor::freezeSeen() {
	if (!ctx_->validVar(seen_.lo)) { seen_.lo = 1; }
	if (!ctx_->validVar(seen_.hi)) { seen_.hi = ctx_->numVars() + 1; }
	for (Var v = seen_.lo; v != seen_.hi; ++v) {
		if (!ctx_->eliminated(v)) { ctx_->setFrozen(v, true); }
	}
	seen_.lo = seen_.hi;
}